

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

macro_call_t try_param_macro_call(c2m_ctx_t c2m_ctx,macro_t m,token_t macro_id)

{
  size_t *psVar1;
  char cVar2;
  short sVar3;
  pre_ctx *ppVar4;
  macro_t pmVar5;
  size_t sVar6;
  ulong uVar7;
  token_arr_t pVVar8;
  VARR_macro_call_t *pVVar9;
  long lVar10;
  MIR_context_t pMVar11;
  VARR_token_t *pVVar12;
  VARR_token_t *pVVar13;
  VARR_char *pVVar14;
  VARR_char *pVVar15;
  undefined8 *puVar16;
  pos_t p;
  uint uVar17;
  int iVar18;
  token_t ptVar19;
  token_t t;
  macro_call_t pmVar20;
  VARR_token_arr_t *pVVar21;
  token_arr_t *ppVVar22;
  gen_ctx *pgVar23;
  MIR_item_t pMVar24;
  c2m_ctx_t pcVar25;
  ulong uVar26;
  macro_call_t *ppmVar27;
  undefined1 *puVar28;
  ulong uVar29;
  char *pcVar30;
  node_t_conflict n;
  undefined4 *puVar31;
  VARR_token_t *pVVar32;
  token_t *pptVar33;
  uint uVar34;
  uint uVar35;
  char *in_RCX;
  c2m_ctx_t pcVar36;
  uint uVar37;
  char *format;
  undefined8 extraout_RDX;
  uint uVar38;
  MIR_context_t pMVar39;
  c2m_ctx_t tokens;
  c2m_ctx_t pcVar40;
  MIR_item_t pMVar41;
  c2m_ctx_t __ptr;
  char *pcVar42;
  char **in_R8;
  token_t t_00;
  MIR_context_t pMVar43;
  size_t sVar44;
  c2m_ctx_t pcVar45;
  MIR_context_t pMVar46;
  size_t __size;
  bool bVar47;
  str_t sVar48;
  char *pcStack_f8;
  size_t sStack_f0;
  MIR_context_t local_60;
  
  ppVar4 = c2m_ctx->pre_ctx;
  while( true ) {
    ptVar19 = get_next_pptoken_1(c2m_ctx,0);
    sVar3 = *(short *)ptVar19;
    if (sVar3 != 0x145) break;
    pop_macro_call(c2m_ctx);
  }
  if ((sVar3 == 10) || (sVar3 == 0x20)) {
    t = get_next_pptoken_1(c2m_ctx,0);
    t_00 = ptVar19;
  }
  else {
    t_00 = (token_t)0x0;
    t = ptVar19;
  }
  if (*(short *)t != 0x28) {
    unget_next_pptoken(c2m_ctx,t);
    if (t_00 != (token_t)0x0) {
      unget_next_pptoken(c2m_ctx,t_00);
    }
    out_token(c2m_ctx,macro_id);
    return (macro_call_t)0x0;
  }
  tokens = (c2m_ctx_t)(macro_id->pos).fname;
  pmVar20 = new_macro_call(m,macro_id->pos);
  pmVar5 = pmVar20->macro;
  pMVar41 = (MIR_item_t)&DAT_00000018;
  pVVar21 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar21 == (VARR_token_arr_t *)0x0) {
LAB_00193c1e:
    mir_varr_error((char *)pMVar41);
  }
  pVVar21->els_num = 0;
  pVVar21->size = 0x10;
  ppVVar22 = (token_arr_t *)malloc(0x80);
  pVVar21->varr = ppVVar22;
  pMVar41 = (MIR_item_t)&DAT_00000018;
  pgVar23 = (gen_ctx *)malloc(0x18);
  if (pgVar23 == (gen_ctx *)0x0) goto LAB_00193c1e;
  pgVar23->ctx = (MIR_context_t)0x0;
  ((pos_t *)&pgVar23->optimize_level)->fname = (char *)0x10;
  pMVar41 = (MIR_item_t)0x80;
  pMVar24 = (MIR_item_t)malloc(0x80);
  pgVar23->curr_func_item = pMVar24;
  pVVar32 = pmVar5->params;
  if (pVVar32 == (VARR_token_t *)0x0) {
LAB_00193c37:
    try_param_macro_call_cold_17();
LAB_00193c3c:
    try_param_macro_call_cold_15();
    goto LAB_00193c41;
  }
  uVar29 = pVVar32->els_num;
  uVar38 = 0;
  uVar35 = 0;
  if (uVar29 != 1) {
LAB_00193740:
    bVar47 = false;
    do {
      tokens = (c2m_ctx_t)0x0;
      pcVar25 = (c2m_ctx_t)get_next_pptoken_1(c2m_ctx,0);
      if (*(short *)&pcVar25->ctx == 0x145) {
        tokens = (c2m_ctx_t)0x0;
        pcVar25 = (c2m_ctx_t)get_next_pptoken_1(c2m_ctx,0);
        pop_macro_call(c2m_ctx);
      }
      uVar17 = *(uint *)&pcVar25->ctx & 0xffff;
      uVar34 = *(uint *)&pcVar25->ctx * 0x10000;
      in_RCX = (char *)(ulong)uVar34;
      uVar37 = uVar34 + 0xfec30000 >> 0x10;
      if ((((uVar37 < 0xb) && (tokens = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar37 & 0x1f) & 1) != 0)) ||
          (in_RCX = (char *)(ulong)CONCAT31((int3)(uVar34 >> 8),uVar34 == 0x230000),
          (bool)(bVar47 & uVar34 == 0x230000))) ||
         (uVar34 = uVar17 ^ 0x29 | uVar38, in_RCX = (char *)(ulong)uVar34, uVar34 == 0)) {
        if (uVar17 != 0x29) {
          in_R8 = (char **)pmVar5->id->repr;
          in_RCX = "unfinished call of macro %s";
          error(c2m_ctx,0x1c3620,(char *)pcVar25->options,pcVar25->env[0].__jmpbuf[0]);
          tokens = pcVar25;
          unget_next_pptoken(c2m_ctx,(token_t)pcVar25);
        }
        pMVar41 = (MIR_item_t)pVVar21->varr;
        if (pMVar41 == (MIR_item_t)0x0) goto LAB_00193c3c;
        uVar26 = pVVar21->els_num + 1;
        if (pVVar21->size < uVar26) {
          sVar44 = (uVar26 >> 1) + uVar26;
          tokens = (c2m_ctx_t)(sVar44 * 8);
          ppVVar22 = (token_arr_t *)realloc(pMVar41,(size_t)tokens);
          pVVar21->varr = ppVVar22;
          pVVar21->size = sVar44;
        }
        uVar7 = pVVar21->els_num;
        uVar26 = uVar7 + 1;
        pVVar21->els_num = uVar26;
        pVVar21->varr[uVar7] = (token_arr_t)pgVar23;
        in_RCX = (char *)(uVar7 | uVar29);
        if ((MIR_context_t)in_RCX == (MIR_context_t)0x0) {
          in_RCX = (char *)pVVar21->varr;
          if ((MIR_context_t)in_RCX == (MIR_context_t)0x0) goto LAB_00193c55;
          pgVar23 = ((MIR_context_t)in_RCX)->gen_ctx;
          if (pgVar23 == (gen_ctx *)0x0) goto LAB_00193c5a;
          tokens = (c2m_ctx_t)pgVar23->ctx;
          if (tokens == (c2m_ctx_t)0x0) {
LAB_00193b7d:
            pVVar21->els_num = uVar7;
            pgVar23 = (&((MIR_context_t)in_RCX)->gen_ctx)[uVar7];
            if ((pgVar23 == (gen_ctx *)0x0) ||
               (pMVar41 = pgVar23->curr_func_item, pMVar41 == (MIR_item_t)0x0)) goto LAB_00193c5f;
            free(pMVar41);
            free(pgVar23);
            goto LAB_00193ba7;
          }
          if (tokens == (c2m_ctx_t)&DAT_00000001) {
            if (pgVar23->curr_func_item == (MIR_item_t)0x0) goto LAB_00193c69;
            if (*pgVar23->curr_func_item->data == 0x20) goto LAB_00193b7d;
          }
        }
        if (uVar26 <= uVar29) {
          if (uVar29 <= uVar26) goto LAB_00193ba7;
          local_60 = (MIR_context_t)0x1c365f;
          goto LAB_00193a8a;
        }
        if (pVVar21->varr == (token_arr_t *)0x0) goto LAB_00193c4b;
        pVVar8 = pVVar21->varr[uVar29];
        if (pVVar8 == (token_arr_t)0x0) goto LAB_00193c50;
        if (pVVar8->els_num != 0) {
          if (pVVar8->varr == (token_t *)0x0) goto LAB_00193c64;
          pcVar25 = (c2m_ctx_t)*pVVar8->varr;
        }
        local_60 = (MIR_context_t)0x1c363c;
        goto LAB_00193a2f;
      }
      in_RCX = (char *)(ulong)(uVar38 | uVar35);
      if (uVar17 == 0x2c && (uVar38 | uVar35) == 0) {
        pMVar41 = (MIR_item_t)pVVar21->varr;
        if (pMVar41 == (MIR_item_t)0x0) goto LAB_00193c32;
        uVar26 = pVVar21->els_num + 1;
        if (pVVar21->size < uVar26) {
          sVar44 = (uVar26 >> 1) + uVar26;
          tokens = (c2m_ctx_t)(sVar44 * 8);
          ppVVar22 = (token_arr_t *)realloc(pMVar41,(size_t)tokens);
          pVVar21->varr = ppVVar22;
          pVVar21->size = sVar44;
        }
        sVar6 = pVVar21->els_num;
        in_RCX = (char *)pVVar21->varr;
        sVar44 = sVar6 + 1;
        pVVar21->els_num = sVar44;
        (&((MIR_context_t)in_RCX)->gen_ctx)[sVar6] = pgVar23;
        pMVar41 = (MIR_item_t)&DAT_00000018;
        pgVar23 = (gen_ctx *)malloc(0x18);
        if (pgVar23 == (gen_ctx *)0x0) goto LAB_00193c1e;
        pgVar23->ctx = (MIR_context_t)0x0;
        ((pos_t *)&pgVar23->optimize_level)->fname = (char *)0x10;
        pMVar41 = (MIR_item_t)0x80;
        pMVar24 = (MIR_item_t)malloc(0x80);
        pgVar23->curr_func_item = pMVar24;
        uVar38 = 0;
        if (sVar44 == uVar29 - 1) {
          pVVar32 = pmVar5->params;
          if (((pVVar32 == (VARR_token_t *)0x0) ||
              (in_RCX = (char *)pVVar32->varr, (MIR_context_t)in_RCX == (MIR_context_t)0x0)) ||
             (pVVar32->els_num <= uVar29 - 1)) goto LAB_00193c28;
          iVar18 = strcmp(*(char **)(*(long *)((long)in_RCX + uVar29 * 8 + -8) + 0x28),"...");
          uVar35 = (uint)(iVar18 == 0);
        }
        else {
          uVar35 = 0;
        }
      }
      else {
        pMVar41 = pgVar23->curr_func_item;
        if (pMVar41 == (MIR_item_t)0x0) goto LAB_00193c2d;
        pcVar42 = (char *)((long)&pgVar23->ctx->gen_ctx + 1);
        if (((pos_t *)&pgVar23->optimize_level)->fname < pcVar42) {
          pMVar41 = (MIR_item_t)realloc(pMVar41,(long)(pcVar42 + ((ulong)pcVar42 >> 1)) * 8);
          pgVar23->curr_func_item = pMVar41;
          ((pos_t *)&pgVar23->optimize_level)->fname = pcVar42 + ((ulong)pcVar42 >> 1);
        }
        pMVar11 = pgVar23->ctx;
        pgVar23->ctx = (MIR_context_t)((long)&pMVar11->gen_ctx + 1);
        (&pgVar23->curr_func_item->data)[(long)pMVar11] = pcVar25;
        if (*(short *)&pcVar25->ctx == 0x28) {
          uVar38 = uVar38 + 1;
        }
        else if (*(short *)&pcVar25->ctx == 0x29) {
          uVar38 = uVar38 - 1;
        }
      }
      bVar47 = *(short *)&pcVar25->ctx == 10;
    } while( true );
  }
  if (pVVar32->varr != (token_t *)0x0) {
    uVar35 = (uint)(*(short *)*pVVar32->varr == 0x10f);
    goto LAB_00193740;
  }
  goto LAB_00193c46;
LAB_00193a8a:
  pMVar41 = (MIR_item_t)&DAT_00000018;
  pgVar23 = (gen_ctx *)malloc(0x18);
  if (pgVar23 != (gen_ctx *)0x0) {
    pgVar23->ctx = (MIR_context_t)0x0;
    ((pos_t *)&pgVar23->optimize_level)->fname = (char *)0x10;
    pMVar41 = (MIR_item_t)malloc(0x80);
    pgVar23->curr_func_item = pMVar41;
    pMVar41 = (MIR_item_t)pVVar21->varr;
    if (pMVar41 != (MIR_item_t)0x0) goto code_r0x00193aca;
    try_param_macro_call_cold_6();
LAB_00193c28:
    try_param_macro_call_cold_2();
LAB_00193c2d:
    try_param_macro_call_cold_1();
LAB_00193c32:
    try_param_macro_call_cold_3();
    goto LAB_00193c37;
  }
  goto LAB_00193c1e;
code_r0x00193aca:
  uVar26 = uVar26 + 1;
  if (pVVar21->size < uVar26) {
    sVar44 = (uVar26 >> 1) + uVar26;
    tokens = (c2m_ctx_t)(sVar44 * 8);
    ppVVar22 = (token_arr_t *)realloc(pMVar41,(size_t)tokens);
    pVVar21->varr = ppVVar22;
    pVVar21->size = sVar44;
  }
  sVar44 = pVVar21->els_num;
  in_RCX = (char *)pVVar21->varr;
  uVar26 = sVar44 + 1;
  pVVar21->els_num = uVar26;
  (&((MIR_context_t)in_RCX)->gen_ctx)[sVar44] = pgVar23;
  if (uVar29 <= uVar26) goto LAB_00193b11;
  goto LAB_00193a8a;
  while( true ) {
    psVar1 = &pVVar32->size + (long)pMVar43;
    pMVar43 = (MIR_context_t)((long)&pMVar43->gen_ctx + 1);
    if (*(int *)(*psVar1 + 0x18) == 0x19) break;
LAB_00193d8d:
    pcVar40 = (c2m_ctx_t)((long)__ptr->env[0].__jmpbuf + (long)&pMVar43[-1].setjmp_addr);
    if (pcVar40 == (c2m_ctx_t)&DAT_00000001) goto LAB_0019413a;
  }
  pcVar40 = (c2m_ctx_t)CONCAT71((int7)(*psVar1 >> 8),pMVar43 < pMVar11);
LAB_00193db0:
  if ((char)pcVar40 == '\0') goto LAB_0019413a;
  pVVar14 = pcVar25->symbol_text;
  if ((pVVar14 == (VARR_char *)0x0) || (__ptr = (c2m_ctx_t)pVVar14->varr, __ptr == (c2m_ctx_t)0x0))
  goto LAB_001941ef;
  pVVar14->els_num = 0;
  pVVar15 = pcVar25->temp_string;
  if ((pVVar15 == (VARR_char *)0x0) || (pVVar15->varr == (char *)0x0)) goto LAB_001941f4;
  pVVar15->els_num = 0;
  uVar29 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar29) {
    pcVar45 = (c2m_ctx_t)((uVar29 >> 1) + uVar29);
    pcVar40 = pcVar45;
    pcVar42 = (char *)realloc(__ptr,(size_t)pcVar45);
    pVVar14->varr = pcVar42;
    pVVar14->size = (size_t)pcVar45;
  }
  sVar44 = pVVar14->els_num;
  pVVar14->els_num = sVar44 + 1;
  pVVar14->varr[sVar44] = '<';
  if (pMVar46 < pMVar43) {
    do {
      pVVar32 = (VARR_token_t *)tokens->env[0].__jmpbuf[0];
      if ((pVVar32 == (VARR_token_t *)0x0) || (tokens->ctx <= pMVar46)) goto LAB_001941ea;
      pcVar42 = *(char **)((&pVVar32->els_num)[(long)pMVar46] + 0x28);
      cVar2 = *pcVar42;
      while (cVar2 != '\0') {
        pVVar14 = pcVar25->symbol_text;
        __ptr = (c2m_ctx_t)pVVar14->varr;
        if (__ptr == (c2m_ctx_t)0x0) {
LAB_001941d1:
          get_header_name_cold_2();
          goto LAB_001941d6;
        }
        uVar29 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar29) {
          pcVar45 = (c2m_ctx_t)((uVar29 >> 1) + uVar29);
          pcVar40 = pcVar45;
          pcVar30 = (char *)realloc(__ptr,(size_t)pcVar45);
          pVVar14->varr = pcVar30;
          pVVar14->size = (size_t)pcVar45;
        }
        sVar44 = pVVar14->els_num;
        pVVar14->els_num = sVar44 + 1;
        pVVar14->varr[sVar44] = cVar2;
        pVVar14 = pcVar25->temp_string;
        __ptr = (c2m_ctx_t)pVVar14->varr;
        if (__ptr == (c2m_ctx_t)0x0) {
          get_header_name_cold_1();
          goto LAB_001941d1;
        }
        cVar2 = *pcVar42;
        uVar29 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar29) {
          pcVar45 = (c2m_ctx_t)((uVar29 >> 1) + uVar29);
          pcVar40 = pcVar45;
          pcVar30 = (char *)realloc(__ptr,(size_t)pcVar45);
          pVVar14->varr = pcVar30;
          pVVar14->size = (size_t)pcVar45;
        }
        sVar44 = pVVar14->els_num;
        pVVar14->els_num = sVar44 + 1;
        pVVar14->varr[sVar44] = cVar2;
        cVar2 = pcVar42[1];
        pcVar42 = pcVar42 + 1;
      }
      pMVar46 = (MIR_context_t)((long)&pMVar46->gen_ctx + 1);
    } while (pMVar46 != pMVar43);
  }
  pVVar14 = pcVar25->symbol_text;
  __ptr = (c2m_ctx_t)pVVar14->varr;
  if (__ptr == (c2m_ctx_t)0x0) goto LAB_001941fe;
  uVar29 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar29) {
    pcVar45 = (c2m_ctx_t)((uVar29 >> 1) + uVar29);
    pcVar40 = pcVar45;
    pcVar42 = (char *)realloc(__ptr,(size_t)pcVar45);
    pVVar14->varr = pcVar42;
    pVVar14->size = (size_t)pcVar45;
  }
  sVar44 = pVVar14->els_num;
  pVVar14->els_num = sVar44 + 1;
  pVVar14->varr[sVar44] = '>';
  pVVar14 = pcVar25->symbol_text;
  __ptr = (c2m_ctx_t)pVVar14->varr;
  if (__ptr == (c2m_ctx_t)0x0) goto LAB_00194203;
  uVar29 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar29) {
    pcVar45 = (c2m_ctx_t)((uVar29 >> 1) + uVar29);
    pcVar40 = pcVar45;
    pcVar42 = (char *)realloc(__ptr,(size_t)pcVar45);
    pVVar14->varr = pcVar42;
    pVVar14->size = (size_t)pcVar45;
  }
  sVar44 = pVVar14->els_num;
  pVVar14->els_num = sVar44 + 1;
  pVVar14->varr[sVar44] = '\0';
  pVVar14 = pcVar25->temp_string;
  __ptr = (c2m_ctx_t)pVVar14->varr;
  if (__ptr == (c2m_ctx_t)0x0) goto LAB_00194208;
  uVar29 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar29) {
    __size = (uVar29 >> 1) + uVar29;
    pcVar42 = (char *)realloc(__ptr,__size);
    pVVar14->varr = pcVar42;
    pVVar14->size = __size;
  }
  sVar44 = pVVar14->els_num;
  pVVar14->els_num = sVar44 + 1;
  pVVar14->varr[sVar44] = '\0';
  pcVar40 = (c2m_ctx_t)((ulong)pMVar39 & 0xffffffff);
  __ptr = tokens;
  del_tokens((VARR_token_t *)tokens,(int)pMVar39,(int)pMVar43 - (int)pMVar39);
  if (pcVar25->symbol_text != (VARR_char *)0x0) {
    if (pcVar25->temp_string == (VARR_char *)0x0) goto LAB_00194212;
    pcVar42 = pcVar25->symbol_text->varr;
    sVar48 = uniq_cstr(pcVar25,pcVar25->temp_string->varr);
    n = new_node(pcVar25,N_STR);
    add_pos(pcVar25,n,p);
    pcStack_f8 = sVar48.s;
    (n->u).l = (mir_long)pcStack_f8;
    sStack_f0 = sVar48.len;
    (n->u).s.len = sStack_f0;
    sVar48 = uniq_cstr(pcVar25,pcVar42);
    pcVar40 = (c2m_ctx_t)0x30;
    __ptr = pcVar25;
    puVar31 = (undefined4 *)reg_malloc(pcVar25,0x30);
    *puVar31 = 0x13e;
    *(VARR_token_t **)(puVar31 + 2) = pVVar12;
    *(VARR_token_t **)(puVar31 + 4) = pVVar13;
    *(char **)(puVar31 + 10) = sVar48.s;
    puVar31[6] = 0;
    *(node_t_conflict *)(puVar31 + 8) = n;
    pVVar32 = (VARR_token_t *)tokens->env[0].__jmpbuf[0];
    if ((pVVar32 != (VARR_token_t *)0x0) && (pMVar39 < tokens->ctx)) {
      (&pVVar32->els_num)[(long)pMVar39] = (size_t)puVar31;
      goto LAB_0019413a;
    }
    goto LAB_001941f9;
  }
  goto LAB_0019420d;
  while( true ) {
    pVVar21->els_num = uVar26 - 1;
    pMVar24 = (MIR_item_t)pVVar21->varr[uVar26 - 1];
    if ((pMVar24 == (MIR_item_t)0x0) ||
       (pMVar41 = (pMVar24->item_link).prev, pMVar41 == (MIR_item_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00193c19;
    }
    free(pMVar41);
    free(pMVar24);
    uVar26 = pVVar21->els_num;
    pMVar41 = pMVar24;
    if (uVar26 <= uVar29) break;
LAB_00193a2f:
    if (pVVar21->varr == (token_arr_t *)0x0) {
LAB_00193c19:
      try_param_macro_call_cold_10();
      goto LAB_00193c1e;
    }
  }
LAB_00193b11:
  in_R8 = (char **)pmVar5->id->repr;
  tokens = (c2m_ctx_t)((pos_t *)&pcVar25->options)->fname;
  error(c2m_ctx,local_60,(char *)tokens,pcVar25->env[0].__jmpbuf[0]);
  in_RCX = (char *)local_60;
LAB_00193ba7:
  pmVar20->args = pVVar21;
  pVVar9 = ppVar4->macro_call_stack;
  pMVar41 = (MIR_item_t)pVVar9->varr;
  if (pMVar41 != (MIR_item_t)0x0) {
    uVar29 = pVVar9->els_num + 1;
    if (pVVar9->size < uVar29) {
      sVar44 = (uVar29 >> 1) + uVar29;
      ppmVar27 = (macro_call_t *)realloc(pMVar41,sVar44 * 8);
      pVVar9->varr = ppmVar27;
      pVVar9->size = sVar44;
    }
    sVar44 = pVVar9->els_num;
    pVVar9->els_num = sVar44 + 1;
    pVVar9->varr[sVar44] = pmVar20;
    return pmVar20;
  }
LAB_00193c41:
  try_param_macro_call_cold_8();
LAB_00193c46:
  try_param_macro_call_cold_16();
LAB_00193c4b:
  try_param_macro_call_cold_12();
LAB_00193c50:
  try_param_macro_call_cold_11();
LAB_00193c55:
  try_param_macro_call_cold_14();
LAB_00193c5a:
  try_param_macro_call_cold_13();
LAB_00193c5f:
  try_param_macro_call_cold_5();
LAB_00193c64:
  try_param_macro_call_cold_7();
LAB_00193c69:
  try_param_macro_call_cold_4();
  pMVar41 = pMVar41[5].item_link.prev;
  pcVar25 = (c2m_ctx_t)(pMVar41->item_link).prev;
  if (pcVar25 != (c2m_ctx_t)0x0) {
    puVar28 = &((token_t)pMVar41->data)->field_0x1;
    if (pMVar41->module < puVar28) {
      pMVar24 = (MIR_item_t)realloc(pcVar25,(long)(puVar28 + ((ulong)puVar28 >> 1)) * 8);
      (pMVar41->item_link).prev = pMVar24;
      pMVar41->module = (MIR_module_t)(puVar28 + ((ulong)puVar28 >> 1));
    }
    pmVar20 = (macro_call_t)pMVar41->data;
    pMVar41->data = (token_t)((long)&pmVar20->macro + 1);
    (&((pMVar41->item_link).prev)->data)[(long)pmVar20] = tokens;
    return pmVar20;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar25 != (c2m_ctx_t)0x0) && (lVar10 = pcVar25->env[0].__jmpbuf[0], lVar10 != 0)) &&
     (in_RCX = (char *)pcVar25->ctx, (MIR_context_t)in_RCX != (MIR_context_t)0x0)) {
    return *(macro_call_t *)(lVar10 + (long)in_RCX * 8 + -8);
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar40 = tokens;
  __ptr = pcVar25;
  if (tokens == (c2m_ctx_t)0x0) {
LAB_001941d6:
    get_header_name_cold_15();
LAB_001941db:
    get_header_name_cold_12();
LAB_001941e0:
    get_header_name_cold_13();
  }
  else {
    pMVar11 = tokens->ctx;
    if (pMVar11 != (MIR_context_t)0x0) {
      pVVar32 = (VARR_token_t *)tokens->env[0].__jmpbuf[0];
      if (pVVar32 == (VARR_token_t *)0x0) goto LAB_001941db;
      pMVar39 = (MIR_context_t)0x0;
      do {
        __ptr = (c2m_ctx_t)(&pVVar32->els_num)[(long)pMVar39];
        if (*(short *)&__ptr->ctx != 0x20) {
          if ((pMVar39 < pMVar11) && (*(int *)(__ptr->env[0].__jmpbuf + 1) == 0x17)) {
            pMVar46 = (MIR_context_t)((long)&pMVar39->gen_ctx + 1);
            pcVar40 = (c2m_ctx_t)CONCAT71((int7)((ulong)tokens >> 8),pMVar46 < pMVar11);
            if (pMVar46 < pMVar11) {
              pVVar12 = (VARR_token_t *)((pos_t *)&__ptr->options)->fname;
              pVVar13 = (VARR_token_t *)__ptr->env[0].__jmpbuf[0];
              p = *(pos_t *)&__ptr->options;
              __ptr = (c2m_ctx_t)(&pVVar32->size)[(long)pMVar39];
              pMVar43 = pMVar46;
              if (*(int *)(__ptr->env[0].__jmpbuf + 1) == 0x19) goto LAB_00193db0;
              __ptr = (c2m_ctx_t)(2 - (long)pMVar11);
              goto LAB_00193d8d;
            }
          }
          break;
        }
        pMVar39 = (MIR_context_t)((long)&pMVar39->gen_ctx + 1);
      } while (pMVar11 != pMVar39);
    }
LAB_0019413a:
    pcVar45 = (c2m_ctx_t)tokens->ctx;
    if (pcVar45 == (c2m_ctx_t)0x0) {
      pcVar36 = (c2m_ctx_t)0x0;
    }
    else {
      puVar16 = (undefined8 *)tokens->env[0].__jmpbuf[0];
      if (puVar16 == (undefined8 *)0x0) goto LAB_001941e0;
      pcVar36 = (c2m_ctx_t)(ulong)(*(short *)*puVar16 == 0x20);
    }
    pcVar40 = (c2m_ctx_t)((long)&pcVar45[-1].gen_ctx + 7);
    if (pcVar36 != pcVar40) {
LAB_001941a4:
      error(pcVar25,0x1c3085,format,in_RCX);
      return (macro_call_t)0x0;
    }
    if ((pcVar36 < pcVar45) && (lVar10 = tokens->env[0].__jmpbuf[0], lVar10 != 0)) {
      ptVar19 = *(token_t *)(lVar10 + (long)pcVar36 * 8);
      sVar3 = *(short *)ptVar19;
      if ((sVar3 == 0x102) || (sVar3 == 0x13e)) {
        pmVar20 = (macro_call_t)get_include_fname(pcVar25,ptVar19,in_R8);
        return pmVar20;
      }
      goto LAB_001941a4;
    }
  }
  get_header_name_cold_14();
LAB_001941ea:
  get_header_name_cold_9();
LAB_001941ef:
  get_header_name_cold_11();
LAB_001941f4:
  get_header_name_cold_10();
LAB_001941f9:
  get_header_name_cold_3();
LAB_001941fe:
  get_header_name_cold_8();
LAB_00194203:
  get_header_name_cold_7();
LAB_00194208:
  get_header_name_cold_6();
LAB_0019420d:
  get_header_name_cold_5();
LAB_00194212:
  get_header_name_cold_4();
  pmVar20 = (macro_call_t)malloc(0x30);
  pmVar20->macro = (macro_t)__ptr;
  (pmVar20->pos).fname = (char *)pcVar40;
  (pmVar20->pos).lno = (int)extraout_RDX;
  (pmVar20->pos).ln_pos = (int)((ulong)extraout_RDX >> 0x20);
  pmVar20->repl_pos = 0;
  pmVar20->args = (VARR_token_arr_t *)0x0;
  pcVar42 = &DAT_00000018;
  pVVar32 = (VARR_token_t *)malloc(0x18);
  pmVar20->repl_buffer = pVVar32;
  if (pVVar32 == (VARR_token_t *)0x0) {
    mir_varr_error(pcVar42);
  }
  pVVar32->els_num = 0;
  pVVar32->size = 0x40;
  pptVar33 = (token_t *)malloc(0x200);
  pVVar32->varr = pptVar33;
  return pmVar20;
}

Assistant:

static macro_call_t try_param_macro_call (c2m_ctx_t c2m_ctx, macro_t m, token_t macro_id) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;
  token_t t1 = get_next_pptoken (c2m_ctx), t2 = NULL;

  while (t1->code == T_EOR) {
    pop_macro_call (c2m_ctx);
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code == ' ' || t1->code == '\n') {
    t2 = t1;
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code != '(') { /* no args: it is not a macro call */
    unget_next_pptoken (c2m_ctx, t1);
    if (t2 != NULL) unget_next_pptoken (c2m_ctx, t2);
    out_token (c2m_ctx, macro_id);
    return NULL;
  }
  mc = new_macro_call (m, macro_id->pos);
  find_args (c2m_ctx, mc);
  VARR_PUSH (macro_call_t, macro_call_stack, mc);
  return mc;
}